

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void PClass::StaticShutdown(void)

{
  PClass *pPVar1;
  REGINFO *ppvVar2;
  FAutoSegIterator *pFVar3;
  ulong uVar4;
  ulong uVar5;
  TArray<unsigned_long_*,_unsigned_long_*> uniqueFPs;
  FAutoSegIterator probe;
  
  TArray<unsigned_long_*,_unsigned_long_*>::TArray(&uniqueFPs,0x40);
  FS_Close();
  uVar5 = 0;
  do {
    if (AllClasses.Count <= uVar5) {
      for (uVar5 = 0; uVar5 < uniqueFPs.Count; uVar5 = uVar5 + 1) {
        if (uniqueFPs.Array[uVar5] != (unsigned_long *)0x0) {
          operator_delete__(uniqueFPs.Array[uVar5]);
        }
      }
      memset(&TypeTable,0,0x1fe8);
      bShutdown = true;
      TArray<PClass_*,_PClass_*>::Clear(&AllClasses);
      TArray<PClassActor_*,_PClassActor_*>::Clear(&PClassActor::AllActorClasses);
      probe.Head = &CRegHead;
      probe.Tail = &CRegTail;
      probe.Probe = &CRegHead;
      while (pFVar3 = FAutoSegIterator::operator++(&probe), *pFVar3->Probe != (REGINFO)0x0) {
        *(undefined8 *)*probe.Probe = 0;
      }
      TArray<unsigned_long_*,_unsigned_long_*>::~TArray(&uniqueFPs);
      return;
    }
    pPVar1 = AllClasses.Array[uVar5];
    AllClasses.Array[uVar5] = (PClass *)0x0;
    ppvVar2 = (REGINFO *)pPVar1->FlatPointers;
    if ((ppvVar2 != (REGINFO *)&TheEnd) && (ppvVar2 != (REGINFO *)pPVar1->Pointers)) {
      for (uVar4 = 0; uniqueFPs.Count != uVar4; uVar4 = uVar4 + 1) {
        if (ppvVar2 == (REGINFO *)uniqueFPs.Array[uVar4]) {
          if (uniqueFPs.Count != (uint)uVar4) goto LAB_0044ac5f;
          break;
        }
      }
      probe.Probe = ppvVar2;
      TArray<unsigned_long_*,_unsigned_long_*>::Push(&uniqueFPs,(unsigned_long **)&probe);
    }
LAB_0044ac5f:
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void PClass::StaticShutdown ()
{
	TArray<size_t *> uniqueFPs(64);
	unsigned int i, j;

	FS_Close();	// this must be done before the classes get deleted.
	for (i = 0; i < PClass::AllClasses.Size(); ++i)
	{
		PClass *type = PClass::AllClasses[i];
		PClass::AllClasses[i] = NULL;
		if (type->FlatPointers != &TheEnd && type->FlatPointers != type->Pointers)
		{
			// FlatPointers are shared by many classes, so we must check for
			// duplicates and only delete those that are unique.
			for (j = 0; j < uniqueFPs.Size(); ++j)
			{
				if (type->FlatPointers == uniqueFPs[j])
				{
					break;
				}
			}
			if (j == uniqueFPs.Size())
			{
				uniqueFPs.Push(const_cast<size_t *>(type->FlatPointers));
			}
		}
	}
	for (i = 0; i < uniqueFPs.Size(); ++i)
	{
		delete[] uniqueFPs[i];
	}
	TypeTable.Clear();
	bShutdown = true;

	AllClasses.Clear();
	PClassActor::AllActorClasses.Clear();

	FAutoSegIterator probe(CRegHead, CRegTail);

	while (*++probe != NULL)
	{
		((ClassReg *)*probe)->MyClass = NULL;
	}

}